

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemSubroutine.h
# Opt level: O0

void __thiscall
slang::ast::SimpleSystemSubroutine::SimpleSystemSubroutine
          (SimpleSystemSubroutine *this,KnownSystemName knownNameId,SubroutineKind kind,
          size_t requiredArgs,
          vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *argTypes,
          Type *returnType,bool isMethod,bool isFirstArgLValue)

{
  pointer in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *in_RDI;
  pointer in_R9;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *unaff_retaddr;
  byte in_stack_00000008;
  byte in_stack_00000010;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *__x;
  
  __x = in_RDI;
  SystemSubroutine::SystemSubroutine
            ((SystemSubroutine *)CONCAT44(in_ESI,in_EDX),(KnownSystemName)((ulong)in_RCX >> 0x20),
             (SubroutineKind)in_RCX);
  (in_RDI->super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__SimpleSystemSubroutine_00e58fe8;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (unaff_retaddr,__x);
  in_RDI[3].super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = in_R9;
  in_RDI[3].super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = in_RCX;
  *(byte *)&in_RDI[4].
            super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
            _M_impl.super__Vector_impl_data._M_start = in_stack_00000008 & 1;
  *(byte *)((long)&in_RDI[4].
                   super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1) = in_stack_00000010 & 1;
  return;
}

Assistant:

SimpleSystemSubroutine(KnownSystemName knownNameId, SubroutineKind kind, size_t requiredArgs,
                           const std::vector<const Type*>& argTypes, const Type& returnType,
                           bool isMethod, bool isFirstArgLValue = false) :
        SystemSubroutine(knownNameId, kind), argTypes(argTypes), returnType(&returnType),
        requiredArgs(requiredArgs), isMethod(isMethod), isFirstArgLValue(isFirstArgLValue) {
        SLANG_ASSERT(requiredArgs <= argTypes.size());
    }